

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall
ON_DimStyle::OverrideFieldsWithDifferentValues
          (ON_DimStyle *this,ON_DimStyle *source,ON_DimStyle *parent)

{
  ON__UINT32 OVar1;
  undefined8 uVar2;
  bool bVar3;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  
  a = ContentHash(source);
  b = ContentHash(parent);
  bVar3 = ::operator==(a,b);
  if (bVar3) {
    OVar1 = this->m_field_override_parent_count;
    this->m_field_override_parent_count = 0;
    this->m_field_override_parent_bits0 = 0;
    this->m_field_override_parent_bits1 = 0;
    this->m_field_override_parent_bits2 = 0;
    this->m_field_override_parent_bits3 = 0;
    if (OVar1 != 0) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_
      ;
      *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
    }
    return;
  }
  SetFieldOverrideAll(this,true);
  OverrideFields(this,source,parent);
  return;
}

Assistant:

void ON_DimStyle::OverrideFieldsWithDifferentValues(
  const ON_DimStyle& source,
  const ON_DimStyle& parent
)
{
  if (source.ContentHash() == parent.ContentHash())
  {
    SetFieldOverrideAll(false);
  }
  else
  {
    SetFieldOverrideAll(true);
    // OverrideFields() will set to false any fields that have equal property values.
    OverrideFields(source, parent);
  }
}